

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall
helics::CoreBroker::findAndNotifyEndpointTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  ushort uVar1;
  byte *__src;
  size_t size;
  pointer ppVar2;
  pointer ppVar3;
  pointer pbVar4;
  BasicHandleInfo *pBVar5;
  pair<helics::GlobalHandle,_unsigned_short> *target;
  GlobalHandle GVar6;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range1;
  uint uVar7;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions_00;
  pointer pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eptTargets;
  ActionMessage link;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  local_138;
  UnknownHandleManager *local_118;
  string *local_110;
  BasicHandleInfo *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  undefined1 local_e8 [8];
  GlobalHandle GStack_e0;
  pointer local_d8;
  uint16_t local_d0;
  byte local_ce;
  SmallBuffer local_a8;
  
  local_118 = &this->unknownHandles;
  local_110 = key;
  local_108 = handleInfo;
  UnknownHandleManager::checkForEndpoints(&local_138,local_118,(string *)key);
  ppVar2 = local_138.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GVar6 = (GlobalHandle)
            local_138.
            super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      pBVar5 = HandleManager::findHandle(&this->handles,*(GlobalHandle *)GVar6);
      uVar1 = (ushort)(((GlobalHandle *)((long)GVar6 + 8))->fed_id).gid;
      uVar7 = (uint)uVar1;
      actions.first = cmd_add_endpoint;
      actions.second = cmd_add_filter;
      if (pBVar5->handleType != FILTER) {
        uVar7 = uVar7 ^ 2;
        actions.first = cmd_add_endpoint;
        actions.second = cmd_add_endpoint;
      }
      connectInterfaces(this,local_108,(uint)uVar1,pBVar5,uVar7,actions);
      GVar6 = (GlobalHandle)((long)GVar6 + 0xc);
    } while (GVar6 != (GlobalHandle)ppVar2);
  }
  UnknownHandleManager::checkForEndpointLinks(&local_100,local_118,(string *)local_110);
  pbVar4 = local_100.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_100.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_add_named_endpoint);
      __src = (byte *)(pbVar8->_M_dataplus)._M_p;
      size = pbVar8->_M_string_length;
      if ((local_a8.heap != __src) && (SmallBuffer::reserve(&local_a8,size), size != 0)) {
        local_a8.bufferSize = size;
        memcpy(local_a8.heap,__src,size);
        size = local_a8.bufferSize;
      }
      local_a8.bufferSize = size;
      GStack_e0 = local_108->handle;
      local_ce = local_ce | 2;
      local_d0 = 0x65;
      checkForNamedInterface(this,(ActionMessage *)local_e8);
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar4);
  }
  if ((local_138.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_138.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    UnknownHandleManager::clearEndpoint(local_118,(string *)local_110);
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForReconnectionEndpoints
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)local_e8,local_118,(string *)local_110);
    ppVar3 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar2 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)GStack_e0;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_d8;
    local_e8._0_4_ = 0;
    local_e8._4_4_ = 0;
    GStack_e0.fed_id.gid = 0;
    GStack_e0.handle.hid = 0;
    local_d8 = (pointer)0x0;
    if (((GlobalHandle)ppVar2 != (GlobalHandle)0x0) &&
       (operator_delete(ppVar2,(long)ppVar3 - (long)ppVar2),
       (GlobalHandle)local_e8 != (GlobalHandle)0x0)) {
      operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
    }
    ppVar2 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      GVar6 = (GlobalHandle)
              local_138.
              super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        pBVar5 = HandleManager::findHandle(&this->handles,*(GlobalHandle *)GVar6);
        uVar1 = (ushort)(((GlobalHandle *)((long)GVar6 + 8))->fed_id).gid;
        uVar7 = (uint)uVar1;
        actions_00.first = cmd_add_endpoint;
        actions_00.second = cmd_add_filter;
        if (pBVar5->handleType != FILTER) {
          uVar7 = uVar7 ^ 2;
          actions_00.first = cmd_add_endpoint;
          actions_00.second = cmd_add_endpoint;
        }
        connectInterfaces(this,local_108,(uint)uVar1,pBVar5,uVar7,actions_00);
        GVar6 = (GlobalHandle)((long)GVar6 + 0xc);
      } while (GVar6 != (GlobalHandle)ppVar2);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_100);
  if ((GlobalHandle)
      local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (GlobalHandle)0x0) {
    operator_delete(local_138.
                    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CoreBroker::findAndNotifyEndpointTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto uHandles = unknownHandles.checkForEndpoints(key);
    for (const auto& target : uHandles) {
        const auto* iface = handles.findHandle(target.first);
        auto destFlags = target.second;
        if (iface->handleType != InterfaceType::FILTER) {
            destFlags = toggle_flag(destFlags, destination_target);
        }

        connectInterfaces(handleInfo,
                          target.second,
                          *iface,

                          destFlags,
                          std::make_pair(CMD_ADD_ENDPOINT,
                                         (iface->handleType != InterfaceType::FILTER) ?
                                             CMD_ADD_ENDPOINT :
                                             CMD_ADD_FILTER));
    }

    auto eptTargets = unknownHandles.checkForEndpointLinks(key);
    for (const auto& ept : eptTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(ept);
        link.setSource(handleInfo.handle);
        setActionFlag(link, destination_target);
        link.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
        checkForNamedInterface(link);
    }

    if (!(uHandles.empty() && eptTargets.empty())) {
        unknownHandles.clearEndpoint(key);
    }

    if (getBrokerState() == BrokerState::OPERATING) {
        uHandles = unknownHandles.checkForReconnectionEndpoints(key);
        for (const auto& target : uHandles) {
            const auto* iface = handles.findHandle(target.first);
            auto destFlags = target.second;
            if (iface->handleType != InterfaceType::FILTER) {
                destFlags = toggle_flag(destFlags, destination_target);
            }

            connectInterfaces(handleInfo,
                              target.second,
                              *iface,

                              destFlags,
                              std::make_pair(CMD_ADD_ENDPOINT,
                                             (iface->handleType != InterfaceType::FILTER) ?
                                                 CMD_ADD_ENDPOINT :
                                                 CMD_ADD_FILTER));
        }
    }
}